

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O1

void __thiscall
TApp_IniNotRequiredPassedNotFound_Test::TestBody(TApp_IniNotRequiredPassedNotFound_Test *this)

{
  bool bVar1;
  long lVar2;
  string noini;
  AssertHelper AStack_f8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0 [2];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TestIniNotExist.ini","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--config","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
  CLI::App::set_config(&(this->super_TApp).app,&local_50,&local_70,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_f0[0].ptr_ = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"--config","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)local_d0,local_b0,local_b0 + local_a8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(this->super_TApp).args,local_f0,&local_b0);
  lVar2 = 0;
  do {
    if (local_c0 + lVar2 != *(undefined1 **)((long)local_d0 + lVar2)) {
      operator_delete(*(undefined1 **)((long)local_d0 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)local_f0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0xfb,
             "Expected: run() throws an exception of type CLI::FileError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_f8,(Message *)local_f0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_f8);
  if (local_f0[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_f0[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_f0[0].ptr_ + 8))();
    }
    local_f0[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return;
}

Assistant:

TEST_F(TApp, IniNotRequiredPassedNotFound) {

    std::string noini = "TestIniNotExist.ini";
    app.set_config("--config", "", "", false);

    args = {"--config", noini};
    EXPECT_THROW(run(), CLI::FileError);
}